

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

PropertyId __thiscall
Js::ParseableFunctionInfo::GetOrAddPropertyIdTracked
          (ParseableFunctionInfo *this,CharacterBuffer<char16_t> *propName)

{
  PropertyId propertyId;
  ScriptContext *this_00;
  bool bVar1;
  PropertyRecord *local_30;
  PropertyRecord *local_28;
  PropertyRecord *propRecord;
  
  local_28 = (PropertyRecord *)0x0;
  this_00 = (this->super_FunctionProxy).m_scriptContext;
  ScriptContext::GetOrAddPropertyRecord(this_00,propName,&local_28);
  propertyId = local_28->pid;
  bVar1 = ScriptContext::IsTrackedPropertyId(this_00,propertyId);
  if (!bVar1) {
    local_30 = local_28;
    JsUtil::
    BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)2>
              ((BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                *)&((this->super_FunctionProxy).m_utf8SourceInfo.ptr)->boundedPropertyRecordHashSet,
               &local_30,&local_28);
  }
  return propertyId;
}

Assistant:

PropertyId
    ParseableFunctionInfo::GetOrAddPropertyIdTracked(JsUtil::CharacterBuffer<WCHAR> const& propName)
    {
        const Js::PropertyRecord* propRecord = nullptr;
        ScriptContext * scriptContext = this->m_scriptContext;
        scriptContext->GetOrAddPropertyRecord(propName, &propRecord);

        PropertyId propertyId = propRecord->GetPropertyId();
        if (!scriptContext->IsTrackedPropertyId(propertyId))
        {
            this->m_utf8SourceInfo->GetBoundedPropertyRecordHashSet()->Item(propRecord);
        }
        return propertyId;
    }